

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

ssize_t __thiscall MemIStream::read(MemIStream *this,int __fd,void *__buf,size_t __nbytes)

{
  void *__dest;
  size_type sVar1;
  int *piVar2;
  char *pcVar3;
  undefined4 in_register_00000034;
  int bytesToRead;
  int local_1c;
  int local_18;
  int local_14;
  void *local_10;
  MemIStream *local_8;
  
  local_10 = (void *)CONCAT44(in_register_00000034,__fd);
  local_14 = (int)__buf;
  local_8 = this;
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->ostream->data);
  local_1c = (int)sVar1 - (int)this->streamptr;
  piVar2 = std::min<int>(&local_14,&local_1c);
  __dest = local_10;
  local_18 = *piVar2;
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x11aada);
  memcpy(__dest,pcVar3 + this->streamptr,(long)local_18);
  this->streamptr = (long)local_14 + this->streamptr;
  return (ulong)CONCAT31((int3)((uint)local_18 >> 8),local_18 < local_14);
}

Assistant:

bool read (char c[], int n) override
    {
        int bytesToRead =
            min (n, static_cast<int> (ostream.data.size () - streamptr));
        memcpy (c, ostream.data.data () + streamptr, bytesToRead);
        streamptr += n;
        return bytesToRead < n;
    }